

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

void CSOAA::do_actual_learning_oaa(ldf *data,single_learner *base,multi_ex *ec_seq)

{
  float fVar1;
  example *peVar2;
  uint64_t uVar3;
  label_t lVar4;
  bool bVar5;
  wclass *pwVar6;
  undefined8 in_RDX;
  example *in_RDI;
  uint64_t old_offset;
  float old_weight;
  label_data simple_label;
  v_array<COST_SENSITIVE::wclass> costs;
  label save_cs_label;
  example **ec;
  iterator __end1_1;
  iterator __begin1_1;
  multi_ex *__range1_1;
  float ec_cost;
  example **example;
  iterator __end1;
  iterator __begin1;
  multi_ex *__range1;
  float max_cost;
  float min_cost;
  example *in_stack_ffffffffffffff18;
  example *in_stack_ffffffffffffff20;
  example *in_stack_ffffffffffffff28;
  example *in_stack_ffffffffffffff30;
  float local_b4;
  float fStack_b0;
  v_array<COST_SENSITIVE::wclass> local_a8;
  label_t local_88;
  wclass *local_80;
  wclass *local_78;
  size_t local_70;
  reference local_68;
  example **local_60;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_58;
  undefined8 local_50;
  float local_44;
  reference local_40;
  example **local_38;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_30 [2];
  float local_20;
  float local_1c;
  undefined8 local_18;
  example *local_8;
  
  local_1c = 3.4028235e+38;
  local_20 = -3.4028235e+38;
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_30[0]._M_current =
       (example **)
       std::vector<example_*,_std::allocator<example_*>_>::begin
                 ((vector<example_*,_std::allocator<example_*>_> *)in_stack_ffffffffffffff18);
  local_38 = (example **)
             std::vector<example_*,_std::allocator<example_*>_>::end
                       ((vector<example_*,_std::allocator<example_*>_> *)in_stack_ffffffffffffff18);
  while (bVar5 = __gnu_cxx::operator!=
                           ((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                             *)in_stack_ffffffffffffff20,
                            (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                             *)in_stack_ffffffffffffff18), bVar5) {
    local_40 = __gnu_cxx::
               __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
               operator*(local_30);
    pwVar6 = v_array<COST_SENSITIVE::wclass>::operator[]
                       ((v_array<COST_SENSITIVE::wclass> *)&((*local_40)->l).simple,0);
    local_44 = pwVar6->x;
    if (local_44 < local_1c) {
      local_1c = local_44;
    }
    if (local_20 < local_44) {
      local_20 = local_44;
    }
    __gnu_cxx::__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
    operator++(local_30);
  }
  local_50 = local_18;
  local_58._M_current =
       (example **)
       std::vector<example_*,_std::allocator<example_*>_>::begin
                 ((vector<example_*,_std::allocator<example_*>_> *)in_stack_ffffffffffffff18);
  local_60 = (example **)
             std::vector<example_*,_std::allocator<example_*>_>::end
                       ((vector<example_*,_std::allocator<example_*>_> *)in_stack_ffffffffffffff18);
  while (bVar5 = __gnu_cxx::operator!=
                           ((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                             *)in_stack_ffffffffffffff20,
                            (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                             *)in_stack_ffffffffffffff18), bVar5) {
    local_68 = __gnu_cxx::
               __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
               operator*(&local_58);
    peVar2 = *local_68;
    local_a8._begin = *(wclass **)&(peVar2->l).multi;
    local_a8._end = (peVar2->l).cs.costs._end;
    local_a8.end_array = (peVar2->l).cs.costs.end_array;
    local_a8.erase_count = (peVar2->l).cs.costs.erase_count;
    fVar1 = (*local_68)->weight;
    local_88 = (label_t)local_a8._begin;
    local_80 = local_a8._end;
    local_78 = local_a8.end_array;
    local_70 = local_a8.erase_count;
    if (((ulong)(local_8->super_example_predict).feature_space[1].indicies.end_array & 0x10000) == 0
       ) {
      pwVar6 = v_array<COST_SENSITIVE::wclass>::operator[](&local_a8,0);
      local_b4 = pwVar6->x;
    }
    else {
      pwVar6 = v_array<COST_SENSITIVE::wclass>::operator[](&local_a8,0);
      if (local_1c < pwVar6->x) {
        local_b4 = 1.0;
        pwVar6 = v_array<COST_SENSITIVE::wclass>::operator[](&local_a8,0);
        (*local_68)->weight = fVar1 * (pwVar6->x - local_1c);
      }
      else {
        local_b4 = -1.0;
        (*local_68)->weight = fVar1 * (local_20 - local_1c);
      }
    }
    peVar2 = *local_68;
    lVar4.weight = fStack_b0;
    lVar4.label = (uint32_t)local_b4;
    (peVar2->l).multi = lVar4;
    (peVar2->l).simple.initial = 0.0;
    in_stack_ffffffffffffff20 = *local_68;
    in_stack_ffffffffffffff18 = local_8;
    v_array<COST_SENSITIVE::wclass>::operator[](&local_a8,0);
    LabelDict::add_example_namespace_from_memory
              ((label_feature_map *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (size_t)in_stack_ffffffffffffff20);
    uVar3 = ((*local_68)->super_example_predict).ft_offset;
    ((*local_68)->super_example_predict).ft_offset =
         (uint64_t)(local_8->super_example_predict).feature_space[2].values._begin;
    LEARNER::learner<char,_example>::learn
              ((learner<char,_example> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (size_t)in_stack_ffffffffffffff20);
    ((*local_68)->super_example_predict).ft_offset = uVar3;
    in_stack_ffffffffffffff30 = *local_68;
    in_stack_ffffffffffffff28 = local_8;
    v_array<COST_SENSITIVE::wclass>::operator[](&local_a8,0);
    LabelDict::del_example_namespace_from_memory
              ((label_feature_map *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (size_t)in_stack_ffffffffffffff20);
    (*local_68)->weight = fVar1;
    peVar2 = *local_68;
    (peVar2->l).multi = local_88;
    (peVar2->l).cs.costs._end = local_80;
    (peVar2->l).cs.costs.end_array = local_78;
    (peVar2->l).cs.costs.erase_count = local_70;
    pwVar6 = v_array<COST_SENSITIVE::wclass>::operator[](&local_a8,0);
    (*local_68)->partial_prediction = pwVar6->partial_prediction;
    __gnu_cxx::__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
    operator++(&local_58);
  }
  return;
}

Assistant:

void do_actual_learning_oaa(ldf& data, single_learner& base, multi_ex& ec_seq)
{
  float min_cost = FLT_MAX;
  float max_cost = -FLT_MAX;

  for (const auto & example : ec_seq)
  {
    float ec_cost = example->l.cs.costs[0].x;
    if (ec_cost < min_cost)
      min_cost = ec_cost;
    if (ec_cost > max_cost)
      max_cost = ec_cost;
  }

  for (const auto & ec : ec_seq)
  {
    // save original variables
    label save_cs_label = ec->l.cs;
    v_array<COST_SENSITIVE::wclass> costs = save_cs_label.costs;

    // build example for the base learner
    label_data simple_label;

    simple_label.initial = 0.;
    float old_weight = ec->weight;
    if (!data.treat_as_classifier)  // treat like regression
      simple_label.label = costs[0].x;
    else  // treat like classification
    {
      if (costs[0].x <= min_cost)
      {
        simple_label.label = -1.;
        ec->weight = old_weight * (max_cost - min_cost);
      }
      else
      {
        simple_label.label = 1.;
        ec->weight = old_weight * (costs[0].x - min_cost);
      }
    }
    ec->l.simple = simple_label;

    // learn
    LabelDict::add_example_namespace_from_memory(data.label_features, *ec, costs[0].class_index);
    uint64_t old_offset = ec->ft_offset;
    ec->ft_offset = data.ft_offset;
    base.learn(*ec);
    ec->ft_offset = old_offset;
    LabelDict::del_example_namespace_from_memory(data.label_features, *ec, costs[0].class_index);
    ec->weight = old_weight;

    // restore original cost-sensitive label, sum of importance weights and partial_prediction
    ec->l.cs = save_cs_label;
    ec->partial_prediction = costs[0].partial_prediction;
  }
}